

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O1

void writeprocs(void)

{
  int iVar1;
  symboltype sVar2;
  int iVar3;
  char label [10];
  int local_50;
  int local_48;
  char local_32 [10];
  
  iVar1 = getnumcodes();
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      while (((getquad(iVar1), local_50 != 0xf || (sVar2 = symclass(local_48), sVar2 != stprocedure)
              ) && (sVar2 = symclass(local_48), sVar2 != stprogram))) {
        iVar1 = iVar1 + 1;
      }
      sVar2 = symclass(local_48);
      if (sVar2 == stprogram) {
        return;
      }
      iVar3 = labelscope(local_48);
      getlabel(local_48,local_32);
      writeproc(iVar1,iVar3);
      iVar1 = iVar1 + 1;
      iVar3 = getnumcodes();
    } while (iVar1 < iVar3);
  }
  return;
}

Assistant:

void    writeprocs(void)
{
    int    i = 0, localvarbytes;
    char    label[LABELSIZE];
    struct quadtype        nextquad;
    
    for (i = 0; i < getnumcodes(); i++)    {
        nextquad = getquad(i);
        
        while ((nextquad.opcode != oplabel
                || symclass(nextquad.op1.opnd) != stprocedure)
               && symclass(nextquad.op1.opnd) != stprogram)
            nextquad = getquad(++i);
        
        if (symclass(nextquad.op1.opnd) == stprogram)
            break;
        
        localvarbytes = labelscope(nextquad.op1.opnd);
        //  printf("Used %d bytes\n", localvarbytes);
        getlabel(nextquad.op1.opnd, label);
        writeproc(i, localvarbytes);
    }
}